

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

EC_KEY * ecdh_generate_key(EC_GROUP *group)

{
  int iVar1;
  EC_KEY *key;
  
  key = EC_KEY_new();
  if (key != (EC_KEY *)0x0) {
    iVar1 = EC_KEY_set_group(key,(EC_GROUP *)group);
    if ((iVar1 != 0) && (iVar1 = EC_KEY_generate_key(key), iVar1 != 0)) {
      return (EC_KEY *)key;
    }
    EC_KEY_free(key);
  }
  return (EC_KEY *)0x0;
}

Assistant:

static EC_KEY *ecdh_generate_key(EC_GROUP *group)
{
    EC_KEY *key;

    if ((key = EC_KEY_new()) == NULL)
        return NULL;
    if (!EC_KEY_set_group(key, group) || !EC_KEY_generate_key(key)) {
        EC_KEY_free(key);
        return NULL;
    }

    return key;
}